

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_right_sequence.h
# Opt level: O0

void __thiscall
bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::clear
          (left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *this,bool releaseMem)

{
  byte in_SIL;
  undefined8 *in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  
  if ((in_SIL & 1) != 0) {
    release((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)
            (CONCAT17(in_SIL,in_stack_fffffffffffffff0) & 0x1ffffffffffffff));
    *in_RDI = 0;
    *(uint *)(in_RDI + 1) = *(uint *)(in_RDI + 1) & 0x80000000;
    *(uint *)(in_RDI + 1) = *(uint *)(in_RDI + 1) & 0x7fffffff;
  }
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  *(uint *)(in_RDI + 2) = *(uint *)(in_RDI + 1) & 0x7fffffff;
  return;
}

Assistant:

void clear(bool releaseMem = false) {
		if (releaseMem) {
			release();
			buf_  = 0;
			cap_  = 0;
			free_ = 0;
		}
		left_ = 0;
		right_= cap_;
	}